

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

ini_section * __thiscall xray_re::xr_ini_file::r_section(xr_ini_file *this,char *sname)

{
  pointer ppiVar1;
  ini_section *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  pointer ppiVar6;
  
  ppiVar6 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (this->m_sections).
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppiVar1 - (long)ppiVar6 >> 3;
  while (uVar3 = uVar5, 0 < (long)uVar3) {
    uVar5 = uVar3 >> 1;
    iVar4 = strcasecmp((ppiVar6[uVar5]->name)._M_dataplus._M_p,sname);
    if (iVar4 < 0) {
      ppiVar6 = ppiVar6 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar3;
    }
  }
  if (ppiVar6 != ppiVar1) {
    piVar2 = *ppiVar6;
    iVar4 = strcasecmp((piVar2->name)._M_dataplus._M_p,sname);
    if (iVar4 == 0) {
      return piVar2;
    }
  }
  msg("can\'t find section %s",sname);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x35,
                "const xr_ini_file::ini_section *xray_re::xr_ini_file::r_section(const char *) const"
               );
}

Assistant:

const xr_ini_file::ini_section* xr_ini_file::r_section(const char* sname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0) {
		msg("can't find section %s", sname);
		xr_not_expected();
	}
	return *it;
}